

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

HighsStatus
formSimplexLpBasisAndFactor(HighsLpSolverObject *solver_object,bool only_from_known_basis)

{
  HighsLp *lp;
  HighsBasis *highs_basis;
  HighsOptions *options;
  HEkk *this;
  HighsStatus HVar1;
  allocator local_b1;
  string local_b0;
  HighsLogOptions local_90;
  
  lp = solver_object->lp_;
  highs_basis = solver_object->basis_;
  options = solver_object->options_;
  this = solver_object->ekk_instance_;
  HighsSparseMatrix::ensureColwise(&lp->a_matrix_);
  considerScaling(options,lp);
  if ((highs_basis->alien != false) ||
     ((highs_basis->valid == false && (highs_basis->useful == true)))) {
    highs_basis->alien = true;
    accommodateAlienBasis(solver_object);
    highs_basis->alien = false;
    HighsLp::unapplyScale(lp);
    return kOk;
  }
  HEkk::moveLp(this,solver_object);
  if ((this->status_).has_basis == false) {
    HVar1 = HEkk::setBasis(this,highs_basis);
    HighsLogOptions::HighsLogOptions(&local_90,&(options->super_HighsOptionsStruct).log_options);
    std::__cxx11::string::string((string *)&local_b0,"setBasis",&local_b1);
    HVar1 = interpretCallStatus(&local_90,HVar1,kOk,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
    if (HVar1 != kError) goto LAB_00271015;
  }
  else {
LAB_00271015:
    HVar1 = HEkk::initialiseSimplexLpBasisAndFactor(this,only_from_known_basis);
    if (HVar1 == kOk) {
      HVar1 = kOk;
      goto LAB_00271030;
    }
  }
  HVar1 = kError;
LAB_00271030:
  formSimplexLpBasisAndFactorReturn(HVar1,solver_object);
  return HVar1;
}

Assistant:

HighsStatus formSimplexLpBasisAndFactor(HighsLpSolverObject& solver_object,
                                        const bool only_from_known_basis) {
  // Ideally, forms a SimplexBasis from the HighsBasis in the
  // HighsLpSolverObject
  //
  // If only_from_known_basis is true and
  // initialiseSimplexLpBasisAndFactor finds that there is no simplex
  // basis, then its error return is passed down
  //
  // If only_from_known_basis is false, then the basis is completed
  // with logicals if it is rank deficient (from singularity or being
  // incomplete)
  //
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsLp& lp = solver_object.lp_;
  HighsBasis& basis = solver_object.basis_;
  HighsOptions& options = solver_object.options_;
  HEkk& ekk_instance = solver_object.ekk_instance_;
  HighsSimplexStatus& ekk_status = ekk_instance.status_;
  lp.ensureColwise();
  // Consider scaling the LP
  const bool new_scaling = considerScaling(options, lp);
  const bool check_basis = basis.alien || (!basis.valid && basis.useful);
  if (check_basis) {
    // The basis needs to be checked for rank deficiency, and possibly
    // completed if it is rectangular
    //
    // If it's not valid but useful, but not alien,
    // accommodateAlienBasis will assert, so make the basis alien
    basis.alien = true;
    assert(!only_from_known_basis);
    accommodateAlienBasis(solver_object);
    basis.alien = false;
    lp.unapplyScale();
    return HighsStatus::kOk;
  }
  // Move the HighsLpSolverObject's LP to EKK
  ekk_instance.moveLp(solver_object);
  if (!ekk_status.has_basis) {
    // The Ekk instance has no simplex basis, so pass the HiGHS basis
    HighsStatus call_status = ekk_instance.setBasis(basis);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "setBasis");
    if (return_status == HighsStatus::kError)
      return formSimplexLpBasisAndFactorReturn(return_status, solver_object);
  }
  // Now form the invert
  assert(ekk_status.has_basis);
  call_status =
      ekk_instance.initialiseSimplexLpBasisAndFactor(only_from_known_basis);
  // If the current basis cannot be inverted, return an error
  if (call_status != HighsStatus::kOk)
    return formSimplexLpBasisAndFactorReturn(HighsStatus::kError,
                                             solver_object);
  // Once the invert is formed, move back the LP and remove any scaling.
  return formSimplexLpBasisAndFactorReturn(HighsStatus::kOk, solver_object);
}